

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flt2vrml.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  bool_t bVar2;
  int iVar3;
  bfile_t *bfile;
  prf_model_t *model;
  FILE *__s;
  undefined4 extraout_var;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  float tmp [3];
  float local_84;
  float local_80;
  float fStack_7c;
  undefined8 *local_78;
  long local_70;
  undefined8 local_68;
  int local_5c;
  int local_58;
  int local_54;
  FILE *local_50;
  undefined1 local_48 [16];
  prf_model_t *local_38;
  
  if ((argc == 1) || (3 < argc)) {
    main_cold_4();
  }
  else {
    prf_init();
    bfile = bf_create_r(argv[1]);
    if (bfile == (bfile_t *)0x0) {
      main_cold_3();
    }
    else {
      model = prf_model_create();
      prf_model_poolmem(model);
      bVar2 = prf_model_load(model,bfile);
      bf_destroy(bfile);
      if (bVar2 == 0) {
        main_cold_2();
      }
      else {
        __s = _stdout;
        if ((argc != 3) || (__s = fopen(argv[2],"w"), __s != (FILE *)0x0)) {
          local_5c = argc;
          fwrite("#VRML V1.0 ascii\n",0x11,1,__s);
          fwrite("#[generated by flt2vrml v0.2, ",0x1e,1,__s);
          fwrite("http://www.sim.no]\n",0x13,1,__s);
          fwrite("\nSeparator {\n",0xd,1,__s);
          indexarray = array_create_int(4);
          vertexarray = array_create_float(4);
          colorarray = array_create_int(4);
          texcoordarray = array_create_float(4);
          facesets = array_create_ptr(4);
          currmodel = model;
          materialLookup = bsp_create(3);
          ofversion = *(uint16_t *)(model->header->data + 8);
          local_38 = model;
          prf_model_traverse_io(model,(prf_cb_t)ZEXT816(0x103e75));
          iVar3 = array_count(facesets);
          if (0 < iVar3) {
            lVar9 = 0;
            local_50 = __s;
            do {
              puVar6 = (undefined8 *)facesets[lVar9];
              local_54 = array_count((void *)puVar6[3]);
              iVar3 = bsp_get_num_points((void *)puVar6[6]);
              local_68 = CONCAT44(extraout_var,iVar3);
              array_count((void *)puVar6[4]);
              iVar3 = array_count((void *)puVar6[5]);
              if (*(short *)((long)puVar6 + 0x3c) < 0) {
                bVar10 = false;
              }
              else {
                bVar10 = puVar6[8] != 0;
              }
              local_78 = puVar6;
              if ((int)local_68 != 0) {
                local_58 = iVar3;
                fwrite("  Separator {\n",0xe,1,__s);
                puVar6 = local_78;
                if (bVar10) {
                  fprintf(__s,"  Texture2 {\n    filename \"%s\"\n  }\n",local_78[8]);
                }
                uVar1 = *(uint *)(puVar6 + 7);
                fVar12 = (float)(uVar1 & 0xff) / 255.0;
                auVar14._0_4_ = (float)(uVar1 & 0xff00);
                auVar14._4_4_ = (float)(uVar1 & 0xff0000);
                auVar14._8_8_ = 0;
                auVar14 = divps(auVar14,_DAT_00110060);
                uVar5 = 0;
                uVar4 = 1;
                uVar13 = auVar14._0_8_;
                if ((*(ushort *)((long)puVar6 + 0x4c) | 2) == 3) {
                  local_70 = CONCAT44(local_70._4_4_,fVar12);
                  local_48 = auVar14;
                  iVar3 = bsp_get_num_points((void *)*puVar6);
                  if (iVar3 < 2) {
                    bsp_get_point((void *)*puVar6,0,&local_84);
                    uVar13 = CONCAT44(fStack_7c,local_80);
                    uVar4 = (undefined4)CONCAT71((int7)((ulong)uVar5 >> 8),1);
                    fVar12 = local_84;
                  }
                  else {
                    uVar4 = 0;
                    fVar12 = (float)local_70;
                    uVar13 = local_48._0_8_;
                  }
                }
                local_48._0_4_ = uVar4;
                local_70 = lVar9;
                if ((char)uVar4 == '\0') {
                  fprintf(__s,"  Material {\n    ambientColor %g %g %g\n    diffuseColor [\n",
                          (double)*(float *)((long)puVar6 + 100),(double)*(float *)(puVar6 + 0xd),
                          (double)*(float *)((long)puVar6 + 0x6c));
                  iVar3 = bsp_get_num_points((void *)*puVar6);
                  if (0 < iVar3) {
                    iVar8 = 0;
                    do {
                      bsp_get_point((void *)*local_78,iVar8,&local_84);
                      pcVar7 = "      %g %g %g\n";
                      if (iVar8 < iVar3 + -1) {
                        pcVar7 = "      %g %g %g,\n";
                      }
                      fprintf(__s,pcVar7,(double)local_84,(double)local_80,(double)fStack_7c);
                      iVar8 = iVar8 + 1;
                    } while (iVar3 != iVar8);
                  }
                  fwrite("    ]\n",6,1,__s);
                  puVar6 = local_78;
                }
                else {
                  fVar11 = (float)((ulong)uVar13 >> 0x20);
                  fprintf(__s,"  Material {\n    diffuseColor %g %g %g\n    ambientColor %g %g %g\n"
                          ,(double)(*(float *)(puVar6 + 0xe) * fVar12),
                          (double)(*(float *)((long)puVar6 + 0x74) * (float)uVar13),
                          (double)(*(float *)(puVar6 + 0xf) * fVar11),
                          (double)(fVar12 * *(float *)((long)puVar6 + 100)),
                          (double)(*(float *)(puVar6 + 0xd) * (float)uVar13),
                          (double)(fVar11 * *(float *)((long)puVar6 + 0x6c)));
                }
                fVar11 = 1.0 - ((float)*(ushort *)((long)puVar6 + 0x4a) / -65535.0 + 1.0) *
                               *(float *)(puVar6 + 0x13);
                fVar12 = 0.0;
                if ((0.003921569 <= fVar11) && (fVar12 = fVar11, 1.0 < fVar11)) {
                  fVar12 = 1.0;
                }
                fprintf(__s,
                        "    specularColor %g %g %g\n    emissiveColor %g %g %g\n    shininess %g\n    transparency %g\n  }\n"
                        ,(double)*(float *)((long)puVar6 + 0x7c),(double)*(float *)(puVar6 + 0x10),
                        (double)*(float *)((long)puVar6 + 0x84),(double)*(float *)(puVar6 + 0x11),
                        (double)*(float *)((long)puVar6 + 0x8c),(double)*(float *)(puVar6 + 0x12),
                        (double)(*(float *)((long)puVar6 + 0x94) * 0.0078125),(double)fVar12);
                fwrite("  Coordinate3 {\n    point [\n",0x1c,1,__s);
                iVar3 = (int)local_68;
                if (0 < iVar3) {
                  iVar8 = 0;
                  do {
                    bsp_get_point((void *)puVar6[6],iVar8,&local_84);
                    pcVar7 = "      %g %g %g\n";
                    if (iVar8 < iVar3 + -1) {
                      pcVar7 = "      %g %g %g,\n";
                    }
                    fprintf(__s,pcVar7,(double)local_84,(double)fStack_7c,(double)-local_80);
                    iVar8 = iVar8 + 1;
                  } while ((int)local_68 != iVar8);
                }
                fwrite("    ]\n  }\n",10,1,__s);
                iVar3 = bsp_get_num_points((void *)puVar6[1]);
                if (iVar3 != 0) {
                  fwrite("  TextureCoordinate2 {\n    point [\n",0x23,1,__s);
                  puVar6 = local_78;
                  if (0 < iVar3) {
                    iVar8 = 0;
                    do {
                      bsp_get_point((void *)puVar6[1],iVar8,&local_84);
                      pcVar7 = "      %g %g\n";
                      if (iVar8 < iVar3 + -1) {
                        pcVar7 = "      %g %g,\n";
                      }
                      fprintf(local_50,pcVar7,(double)local_84,(double)local_80);
                      iVar8 = iVar8 + 1;
                    } while (iVar3 != iVar8);
                  }
                  __s = local_50;
                  fwrite("    ]\n  }\n",10,1,local_50);
                }
                lVar9 = local_70;
                if (local_54 != 0) {
                  if (local_48[0] == '\0') {
                    fwrite("  MaterialBinding {\n    value PER_VERTEX_INDEXED\n  }\n",0x35,1,__s);
                    fwrite("  IndexedFaceSet {\n",0x13,1,__s);
                    fwrite("    materialIndex [\n      ",0x1a,1,__s);
                    puVar6 = local_78;
                    print_index_array((FILE *)__s,(int *)local_78[2]);
                    fwrite("    ]\n}\n",8,1,__s);
                  }
                  else {
                    fwrite("  IndexedFaceSet {\n",0x13,1,__s);
                    puVar6 = local_78;
                  }
                  fwrite("    coordIndex [\n      ",0x17,1,__s);
                  print_index_array((FILE *)__s,(int *)puVar6[3]);
                  fwrite("    ]\n",6,1,__s);
                  if (local_58 != 0) {
                    fwrite("    textureCoordIndex [\n      ",0x1e,1,__s);
                    print_index_array((FILE *)__s,(int *)puVar6[5]);
                    fwrite("    ]\n",6,1,__s);
                  }
                  fwrite("  }\n",4,1,__s);
                }
                fwrite("  }\n",4,1,__s);
              }
              puVar6 = (undefined8 *)facesets[lVar9];
              bsp_destroy((void *)*puVar6);
              bsp_destroy((void *)puVar6[1]);
              bsp_destroy((void *)puVar6[6]);
              array_destroy((void *)puVar6[3]);
              array_destroy((void *)puVar6[4]);
              array_destroy((void *)puVar6[5]);
              array_destroy((void *)puVar6[2]);
              free(puVar6);
              facesets[lVar9] = (void *)0x0;
              lVar9 = lVar9 + 1;
              iVar3 = array_count(facesets);
            } while (lVar9 < iVar3);
          }
          fwrite("}\n",2,1,__s);
          array_destroy(indexarray);
          array_destroy(vertexarray);
          array_destroy(colorarray);
          array_destroy(texcoordarray);
          array_destroy(facesets);
          bsp_destroy(materialLookup);
          if (local_5c == 3) {
            fclose(__s);
          }
          prf_model_destroy(local_38);
          prf_exit();
          return 0;
        }
        main_cold_1();
      }
    }
  }
  return -1;
}

Assistant:

int main(int argc, char ** argv )
{
  bfile_t * modelfile;
  prf_model_t * model;
  FILE * vrml;

  if ( argc == 1 || argc > 3 ) {
    fprintf( stderr, "Usage: %s <flt-file> [<filename.wrl>]\n", argv[0] );
    return -1;
  }

  prf_init();

  modelfile = bf_create_r( argv[1] );
  if ( ! modelfile ) {
    fprintf( stderr, "Error: Couldn't open file named \"%s\".\n", argv[1] );
    prf_exit();
    return -1;
  }

  model = prf_model_create();
  assert( model != NULL );
  prf_model_poolmem( model );

  if ( ! prf_model_load( model, modelfile ) ) {
    bf_destroy( modelfile );
    prf_model_destroy( model );
    prf_exit();
    fprintf( stderr, "Error: Couldn't load Open Flight file \"%s\".\n",
      argv[1] );
    return -1;
  }
  bf_destroy( modelfile );

  if ( argc == 3 ) {
    vrml = fopen( argv[2], "w" );
    if ( ! vrml ) {
      perror( "fopen()" );
      prf_model_destroy( model );
      prf_exit();
      return -1;
    }
  } else {
    vrml = stdout;
  }

  flt2vrml( model, vrml );

  if ( argc == 3 ) fclose( vrml );
  prf_model_destroy( model );
  prf_exit();
  return 0;
}